

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait_strategy_test.cc
# Opt level: O1

void __thiscall
disruptor::test::BusySpinStrategy::SignalTimeoutWaitingOnCursor::test_method
          (SignalTimeoutWaitingOnCursor *this)

{
  atomic<long> *paVar1;
  thread waiter2;
  thread waiter;
  atomic<long> return_value;
  undefined **local_110;
  undefined1 local_108;
  undefined8 *local_100;
  __atomic_base<long> **local_f8;
  undefined8 *local_f0;
  __atomic_base<long> *local_e8;
  undefined1 local_e0;
  undefined8 local_d8;
  shared_count sStack_d0;
  undefined **local_c8;
  undefined1 local_c0;
  undefined8 *local_b8;
  undefined8 **local_b0;
  __atomic_base<long> local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  return_value.super___atomic_base<long>._M_i = (__atomic_base<long>)-1;
  waiter._M_id._M_thread = (id)0;
  local_110 = (undefined **)operator_new(0x18);
  *local_110 = (undefined *)&PTR___State_0011c688;
  local_110[1] = (undefined *)this;
  local_110[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter,&local_110,0);
  if (local_110 != (undefined **)0x0) {
    (**(code **)(*local_110 + 8))();
  }
  std::thread::join();
  local_40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x54);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_0011ccc8;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  waiter2._M_id._M_thread = (id)(id)return_value.super___atomic_base<long>._M_i;
  local_e0 = return_value.super___atomic_base<long>._M_i == -3;
  local_d8 = 0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_98 = "";
  local_f8 = &local_e8;
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_0011cd40;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f0;
  local_f0 = &kTimeoutSignal;
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_0011cd40;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_e8 = (__atomic_base<long> *)&waiter2;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d0);
  waiter2._M_id._M_thread = (id)0;
  local_110 = (undefined **)operator_new(0x18);
  *local_110 = (undefined *)&PTR___State_0011c6c8;
  local_110[1] = (undefined *)this;
  local_110[2] = (undefined *)&return_value;
  std::thread::_M_start_thread(&waiter2,&local_110,0);
  if (local_110 != (undefined **)0x0) {
    (**(code **)(*local_110 + 8))();
  }
  LOCK();
  paVar1 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).cursor.sequence_;
  (paVar1->super___atomic_base<long>)._M_i = (paVar1->super___atomic_base<long>)._M_i + 1;
  UNLOCK();
  std::thread::join();
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x5e);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_0011ccc8;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_e8 = &local_a8;
  local_a8 = return_value.super___atomic_base<long>._M_i;
  local_e0 = return_value.super___atomic_base<long>._M_i == 0;
  local_d8 = 0;
  sStack_d0.pi_ = (sp_counted_base *)0x0;
  local_a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/karopawil[P]disruptor--/test/wait_strategy_test.cc"
  ;
  local_98 = "";
  local_108 = 0;
  local_110 = &PTR__lazy_ostream_0011cd40;
  local_100 = &boost::unit_test::lazy_ostream::inst;
  local_f8 = &local_e8;
  local_f0 = &kFirstSequenceValue;
  local_c0 = 0;
  local_c8 = &PTR__lazy_ostream_0011cd40;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_f0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_d0);
  if (waiter2._M_id._M_thread == 0) {
    if (waiter._M_id._M_thread == 0) {
      return;
    }
    std::terminate();
  }
  std::terminate();
}

Assistant:

BOOST_AUTO_TEST_CASE(SignalTimeoutWaitingOnCursor) {
  std::atomic<int64_t> return_value(kInitialCursorValue);

  std::thread waiter([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted,
                                        std::chrono::microseconds(1L)));
  });

  waiter.join();
  BOOST_CHECK_EQUAL(return_value.load(), kTimeoutSignal);

  std::thread waiter2([this, &return_value]() {
    return_value.store(strategy.WaitFor(kFirstSequenceValue, cursor, dependents,
                                        alerted, std::chrono::seconds(1L)));
  });

  cursor.IncrementAndGet(1L);
  strategy.SignalAllWhenBlocking();
  waiter2.join();
  BOOST_CHECK_EQUAL(return_value.load(), kFirstSequenceValue);
}